

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall Wasm::WasmBytecodeGenerator::EnregisterLocals(WasmBytecodeGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  uint32 firstTmpReg;
  BOOL BVar4;
  Local type;
  undefined4 *puVar5;
  WasmLocal *pWVar6;
  WasmRegisterSpace *this_00;
  WasmLocal WVar7;
  WasmLocal *pWVar8;
  ulong uVar9;
  ulong uVar10;
  
  firstTmpReg = WasmFunctionInfo::GetLocalCount(this->m_funcInfo);
  uVar10 = (ulong)firstTmpReg;
  if (firstTmpReg == 0) {
    pWVar6 = (WasmLocal *)&DAT_00000008;
  }
  else {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00f305c6;
      *puVar5 = 0;
    }
    pWVar6 = (WasmLocal *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(&(this->m_alloc).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,uVar10 * 8);
    if (pWVar6 == (WasmLocal *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00f305c6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pWVar8 = pWVar6;
    do {
      pWVar8->location = 0xffffffff;
      pWVar8->type = Limit;
      pWVar8 = pWVar8 + 1;
    } while (pWVar8 != pWVar6 + uVar10);
  }
  this->m_locals = pWVar6;
  Js::FunctionBody::SetFirstTmpReg((this->m_funcInfo->m_body).ptr,firstTmpReg);
  if (uVar10 != 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar9 = 0;
    do {
      type = WasmFunctionInfo::GetLocal(this->m_funcInfo,(uint32)uVar9);
      this_00 = GetRegisterSpace(this,type);
      WVar7.location = WAsmJs::RegisterSpace::AcquireRegister(this_00);
      WVar7.type = type;
      this->m_locals[uVar9] = WVar7;
      AVar3 = WasmFunctionInfo::GetParamCount(this->m_funcInfo);
      if (AVar3 <= uVar9) {
        switch(type) {
        case FirstLocalType:
          (*this->m_writer->_vptr_IWasmByteCodeWriter[10])
                    (this->m_writer,9,(ulong)this->m_locals[uVar9].location,0);
          break;
        case I64:
          (*this->m_writer->_vptr_IWasmByteCodeWriter[0xb])
                    (this->m_writer,0xb,(ulong)this->m_locals[uVar9].location,0);
          break;
        case F32:
          (*this->m_writer->_vptr_IWasmByteCodeWriter[0xc])
                    (0,this->m_writer,0xd,(ulong)this->m_locals[uVar9].location);
          break;
        case F64:
          (*this->m_writer->_vptr_IWasmByteCodeWriter[0xd])
                    (0,this->m_writer,0xf,(ulong)this->m_locals[uVar9].location);
          break;
        case V128:
          Simd::EnsureSimdIsEnabled();
          (*this->m_writer->_vptr_IWasmByteCodeWriter[0x17])
                    (this->m_writer,0x18b,(ulong)this->m_locals[uVar9].location,0,0,0,0);
          break;
        default:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x287,"((0))","(0)");
          if (!bVar2) goto LAB_00f305c6;
          *puVar5 = 0;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::EnregisterLocals()
{
    uint32 nLocals = m_funcInfo->GetLocalCount();
    m_locals = AnewArray(&m_alloc, WasmLocal, nLocals);

    m_funcInfo->GetBody()->SetFirstTmpReg(nLocals);
    for (uint32 i = 0; i < nLocals; ++i)
    {
        WasmTypes::WasmType type = m_funcInfo->GetLocal(i);
        WasmRegisterSpace* regSpace = GetRegisterSpace(type);
        m_locals[i] = WasmLocal(regSpace->AcquireRegister(), type);

        // Zero only the locals not corresponding to formal parameters.
        if (i >= m_funcInfo->GetParamCount()) {
            switch (type)
            {
            case WasmTypes::F32:
                m_writer->AsmFloat1Const1(Js::OpCodeAsmJs::Ld_FltConst, m_locals[i].location, 0.0f);
                break;
            case WasmTypes::F64:
                m_writer->AsmDouble1Const1(Js::OpCodeAsmJs::Ld_DbConst, m_locals[i].location, 0.0);
                break;
            case WasmTypes::I32:
                m_writer->AsmInt1Const1(Js::OpCodeAsmJs::Ld_IntConst, m_locals[i].location, 0);
                break;
            case WasmTypes::I64:
                m_writer->AsmLong1Const1(Js::OpCodeAsmJs::Ld_LongConst, m_locals[i].location, 0);
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
            {
                Simd::EnsureSimdIsEnabled();
                m_writer->WasmSimdConst(Js::OpCodeAsmJs::Simd128_LdC, m_locals[i].location, 0, 0, 0, 0);
                break;
            }
#endif
            default:
                Assume(UNREACHED);
            }
        }
    }
}